

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_schnorrsig_sign_internal
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  undefined4 extraout_EAX;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uchar *msg_00;
  code *pcVar12;
  secp256k1_gej *r_00;
  secp256k1_context *ctx_00;
  secp256k1_keypair *r_01;
  uchar *puVar13;
  uchar *p;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  unsigned_long _zzq_result_1;
  byte local_2a4;
  uchar *local_2a0;
  size_t local_298;
  secp256k1_scalar sk;
  int vflag;
  secp256k1_scalar local_238;
  uchar seckey [32];
  uchar buf [32];
  uchar pk_buf [32];
  secp256k1_ge r;
  secp256k1_ge pk;
  secp256k1_scalar e;
  secp256k1_gej rj;
  
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_8();
LAB_0012487d:
    secp256k1_schnorrsig_sign_internal_cold_7();
    return 0;
  }
  if ((ctx->ecmult_gen_ctx).built == 0) goto LAB_0012487d;
  if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_6();
    return 0;
  }
  if (msglen != 0 && msg == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_5();
    return 0;
  }
  if (keypair == (secp256k1_keypair *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_4();
    return 0;
  }
  pcVar12 = nonce_function_bip340;
  if (noncefp != (secp256k1_nonce_function_hardened)0x0) {
    pcVar12 = noncefp;
  }
  r_00 = (secp256k1_gej *)&sk;
  r_01 = keypair;
  uVar7 = secp256k1_keypair_load(ctx,(secp256k1_scalar *)r_00,&pk,keypair);
  secp256k1_fe_verify(&pk.y);
  if (pk.y.normalized == 0) {
    secp256k1_schnorrsig_sign_internal_cold_3();
    puVar13 = msg;
  }
  else {
    if (((byte)pk.y.n[0] & 1) != 0) {
      secp256k1_scalar_negate(&sk,&sk);
    }
    secp256k1_scalar_get_b32(seckey,&sk);
    r_01 = (secp256k1_keypair *)pk_buf;
    secp256k1_fe_get_b32((uchar *)r_01,&pk.x);
    iVar8 = (*pcVar12)(buf,msg,msglen,seckey,(uchar *)r_01,"BIP0340/nonce",0xd,ndata);
    secp256k1_scalar_set_b32(&local_238,buf,(int *)0x0);
    secp256k1_scalar_verify(&local_238);
    auVar15._0_4_ = -(uint)((int)local_238.d[2] == 0 && (uint)local_238.d[0] == 0);
    auVar15._4_4_ = -(uint)(local_238.d[2]._4_4_ == 0 && local_238.d[0]._4_4_ == 0);
    auVar15._8_4_ = -(uint)((int)local_238.d[3] == 0 && (int)local_238.d[1] == 0);
    auVar15._12_4_ = -(uint)(local_238.d[3]._4_4_ == 0 && local_238.d[1]._4_4_ == 0);
    iVar9 = movmskps(extraout_EAX,auVar15);
    if (iVar8 == 0) {
      uVar7 = 0;
    }
    if (iVar9 == 0xf) {
      uVar7 = 0;
    }
    local_2a4 = (byte)uVar7 ^ 1;
    vflag = uVar7 ^ 1;
    secp256k1_scalar_verify(&secp256k1_scalar_one);
    rj.x.n[0] = 0x4d430005;
    rj.x.n[2] = 0x20;
    rj.x.n[3] = 0;
    rj.x.n[4] = 0;
    rj.x.magnitude = 0;
    rj.x.normalized = 0;
    r.x.n[0] = 0;
    keypair = (secp256k1_keypair *)((long)vflag - 1);
    uVar11 = CONCAT44(local_238.d[0]._4_4_,(uint)local_238.d[0]) & (ulong)keypair;
    local_238.d[0]._0_4_ = vflag & 1U | (uint)uVar11;
    local_238.d[0]._4_4_ = (int)(uVar11 >> 0x20);
    auVar6._4_4_ = local_238.d[1]._4_4_;
    auVar6._0_4_ = (int)local_238.d[1];
    auVar6._8_4_ = (int)local_238.d[2];
    auVar6._12_4_ = local_238.d[2]._4_4_;
    auVar16._8_4_ = (int)keypair;
    auVar16._0_8_ = keypair;
    auVar16._12_4_ = (int)((ulong)keypair >> 0x20);
    auVar16 = auVar16 & auVar6;
    local_238.d[1]._0_4_ = auVar16._0_4_;
    local_238.d[1]._4_4_ = auVar16._4_4_;
    local_238.d[2]._0_4_ = auVar16._8_4_;
    local_238.d[2]._4_4_ = auVar16._12_4_;
    uVar11 = CONCAT44(local_238.d[3]._4_4_,(int)local_238.d[3]) & (ulong)keypair;
    local_238.d[3]._0_4_ = (int)uVar11;
    local_238.d[3]._4_4_ = (int)(uVar11 >> 0x20);
    rj.x.n[1] = (uint64_t)&local_238;
    secp256k1_scalar_verify(&local_238);
    r_00 = &rj;
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,r_00,&local_238);
    secp256k1_ge_set_gej(&r,r_00);
    puVar13 = (uchar *)(ulong)uVar7;
    local_2a0 = msg;
    local_298 = msglen;
    if (ctx->declassify == 0) goto LAB_00124622;
  }
  uVar7 = (uint)puVar13;
  secp256k1_schnorrsig_sign_internal_cold_1();
LAB_00124622:
  ctx_00 = (secp256k1_context *)&r.y;
  secp256k1_fe_normalize_var((secp256k1_fe *)ctx_00);
  secp256k1_fe_verify((secp256k1_fe *)ctx_00);
  if (r.y.normalized == 0) {
    secp256k1_schnorrsig_sign_internal_cold_2();
    iVar8 = secp256k1_schnorrsig_sign_internal
                      (ctx_00,(uchar *)r_00,msg_00,0x20,keypair,nonce_function_bip340,r_01);
    return iVar8;
  }
  if (((byte)r.y.n[0] & 1) != 0) {
    secp256k1_scalar_negate(&local_238,&local_238);
  }
  secp256k1_fe_normalize_var(&r.x);
  secp256k1_fe_get_b32(sig64,&r.x);
  secp256k1_schnorrsig_challenge(&e,sig64,local_2a0,local_298,pk_buf);
  secp256k1_scalar_mul(&e,&e,&sk);
  secp256k1_scalar_add(&e,&e,&local_238);
  secp256k1_scalar_get_b32(sig64 + 0x20,&e);
  auVar15 = ZEXT216(CONCAT11(local_2a4 - 1,local_2a4 - 1));
  auVar15 = pshuflw(auVar15,auVar15,0);
  uVar14 = auVar15._0_4_;
  lVar10 = 0;
  do {
    puVar1 = (uint *)(sig64 + lVar10);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    puVar2 = (uint *)(sig64 + lVar10);
    *puVar2 = *puVar1 & uVar14;
    puVar2[1] = uVar3 & uVar14;
    puVar2[2] = uVar4 & uVar14;
    puVar2[3] = uVar5 & uVar14;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x40);
  local_238.d[0]._0_4_ = 0;
  local_238.d[0]._4_4_ = 0;
  local_238.d[1]._0_4_ = 0;
  local_238.d[1]._4_4_ = 0;
  local_238.d[2]._0_4_ = 0;
  local_238.d[2]._4_4_ = 0;
  local_238.d[3]._0_4_ = 0;
  local_238.d[3]._4_4_ = 0;
  sk.d[0] = 0;
  sk.d[1] = 0;
  sk.d[2] = 0;
  sk.d[3] = 0;
  seckey[0] = '\0';
  seckey[1] = '\0';
  seckey[2] = '\0';
  seckey[3] = '\0';
  seckey[4] = '\0';
  seckey[5] = '\0';
  seckey[6] = '\0';
  seckey[7] = '\0';
  seckey[8] = '\0';
  seckey[9] = '\0';
  seckey[10] = '\0';
  seckey[0xb] = '\0';
  seckey[0xc] = '\0';
  seckey[0xd] = '\0';
  seckey[0xe] = '\0';
  seckey[0xf] = '\0';
  seckey[0x10] = '\0';
  seckey[0x11] = '\0';
  seckey[0x12] = '\0';
  seckey[0x13] = '\0';
  seckey[0x14] = '\0';
  seckey[0x15] = '\0';
  seckey[0x16] = '\0';
  seckey[0x17] = '\0';
  seckey[0x18] = '\0';
  seckey[0x19] = '\0';
  seckey[0x1a] = '\0';
  seckey[0x1b] = '\0';
  seckey[0x1c] = '\0';
  seckey[0x1d] = '\0';
  seckey[0x1e] = '\0';
  seckey[0x1f] = '\0';
  memset(&rj,0,0x98);
  return uVar7;
}

Assistant:

static int secp256k1_schnorrsig_sign_internal(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg, msglen, seckey, pk_buf, bip340_algo, sizeof(bip340_algo), ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    secp256k1_memclear(seckey, sizeof(seckey));
    secp256k1_gej_clear(&rj);

    return ret;
}